

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_OKIM6295_Reg(VGMPlayer *this)

{
  byte bVar1;
  byte bVar2;
  CHIP_DEVICE *pCVar3;
  byte bVar4;
  
  pCVar3 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        this->_fileData[(ulong)this->_filePos + 1] >> 7);
  if ((pCVar3 != (CHIP_DEVICE *)0x0) && (pCVar3->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    bVar1 = this->_fileData[(ulong)this->_filePos + 2];
    bVar4 = this->_fileData[(ulong)this->_filePos + 1] & 0x7f;
    bVar2 = bVar1 & 0x7f;
    if (bVar4 != 0xb) {
      bVar2 = bVar1;
    }
    (*pCVar3->write8)((pCVar3->base).defInf.dataPtr,bVar4,bVar2);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_OKIM6295_Reg(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	UINT8 ofs = fData[0x01] & 0x7F;
	UINT8 data = fData[0x02];
	if (ofs == 0x0B)
	{
		if (data & 0x80)
		{
			data &= 0x7F;	// remove "pin7" bit (bug in some MAME VGM logs)
			//emu_logf(&_logger, PLRLOG_WARN, "OKIM6295 SetClock command (%02X %02X) includes Pin7 bit!\n",
			//	fData[0x00], fData[0x01]);
		}
	}
	
	cDev->write8(cDev->base.defInf.dataPtr, ofs, data);
	return;
}